

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

void __thiscall
CVmObjFileName::restore_from_file
          (CVmObjFileName *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int sfid;
  int iVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  __jmp_buf_tag *__env;
  char *pcVar5;
  undefined8 uVar6;
  char *__s;
  undefined8 *puVar7;
  long *plVar8;
  ulong buflen;
  char sfbuf [4096];
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  lVar3 = CVmFile::read_int4(fp);
  sfid = (int)lVar3;
  if (sfid == 0) {
    pcVar5 = (char *)_ZTW11G_err_frame();
    sfbuf._8_8_ = *(undefined8 *)pcVar5;
    uVar6 = _ZTW11G_err_frame();
    *(char **)uVar6 = sfbuf;
    __env = (__jmp_buf_tag *)(sfbuf + 0x18);
    sfbuf._0_4_ = _setjmp(__env);
    if (sfbuf._0_4_ == 0) {
      uVar2 = CVmFile::read_uint2(fp);
      buflen = (ulong)uVar2;
      pcVar5 = lib_alloc_str(buflen + 1);
      CVmFile::read_bytes(fp,pcVar5,buflen);
      pcVar5[buflen] = '\0';
      __s = url_to_local(pcVar5,buflen,1);
      sVar4 = strlen(__s);
      __env = (__jmp_buf_tag *)vm_filnam_ext::alloc_ext(this,0,__s,sVar4);
    }
    else {
      __s = (char *)0x0;
      pcVar5 = __s;
    }
    if (-1 < (short)sfbuf._0_4_) {
      sfbuf._0_4_ = sfbuf._0_4_ | 0x8000;
      lib_free_str(__s);
      lib_free_str(pcVar5);
    }
    uVar6 = sfbuf._8_8_;
    pcVar5 = (char *)_ZTW11G_err_frame();
    *(undefined8 *)pcVar5 = uVar6;
    if ((sfbuf._0_4_ & 0x4001) != 0) {
      puVar7 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar7 & 2) != 0) {
        plVar8 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar8 + 0x10));
      }
      uVar6 = sfbuf._16_8_;
      plVar8 = (long *)_ZTW11G_err_frame();
      *(undefined8 *)(*plVar8 + 0x10) = uVar6;
      err_rethrow();
    }
    if ((sfbuf._0_4_ & 2) != 0) {
      free((void *)sfbuf._16_8_);
    }
  }
  else {
    iVar1 = CVmObjFile::sfid_to_path(sfbuf,0x1000,sfid);
    sVar4 = strlen(sfbuf);
    __env = (__jmp_buf_tag *)vm_filnam_ext::alloc_ext(this,sfid,sfbuf,sVar4);
    *(char *)((long)__env->__jmpbuf + 4) = (char)iVar1;
  }
  (this->super_CVmObject).ext_ = (char *)__env;
  return;
}

Assistant:

void CVmObjFileName::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the special file ID */
    int32_t sfid = fp->read_int4();

    /* if there's a special file ID, look it up; otherwise read the name */
    vm_filnam_ext *ext;
    if (sfid != 0)
    {
        /* get the special file path */
        char sfbuf[OSFNMAX];
        int ok = CVmObjFile::sfid_to_path(vmg_ sfbuf, sizeof(sfbuf), sfid);

        /* create the extension */
        ext = vm_filnam_ext::alloc_ext(vmg_ this, sfid, sfbuf, strlen(sfbuf));

        /* note whether the ID is valid on this platform */
        ext->sfid_valid = (char)ok;
    }
    else
    {
        char *uni = 0, *lcl = 0;
        err_try
        {
            /* read the filename length */
            size_t len = fp->read_uint2();
            
            /* load the saved universal path */
            uni = lib_alloc_str(len + 1);
            fp->read_bytes(uni, len);
            uni[len] = '\0';
            
            /* convert the saved universal path to local notation */
            lcl = url_to_local(vmg_ uni, len, TRUE);
        
            /* allocate the extension structure */
            ext = vm_filnam_ext::alloc_ext(vmg_ this, 0, lcl, strlen(lcl));
        }
        err_finally
        {
            /* we're done with the allocated buffers */
            lib_free_str(lcl);
            lib_free_str(uni);
        }